

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIImageList.cpp
# Opt level: O3

bool __thiscall
irr::gui::CGUIImageList::createImageList
          (CGUIImageList *this,ITexture *texture,dimension2d<int> imageSize,bool useAlphaChannel)

{
  int iVar1;
  
  if (texture != (ITexture *)0x0) {
    *(ITexture **)&(this->super_IGUIImageList).field_0x10 = texture;
    *(int *)(texture->_vptr_ITexture[-3] + 8 + (long)&(texture->NamedPath).Path) =
         *(int *)(texture->_vptr_ITexture[-3] + 8 + (long)&(texture->NamedPath).Path) + 1;
    *(dimension2d<int> *)&(this->super_IGUIImageList).field_0x1c = imageSize;
    iVar1 = (int)((ulong)(texture->Size).Width / ((ulong)imageSize & 0xffffffff));
    this->ImagesPerRow = iVar1;
    *(int *)&(this->super_IGUIImageList).field_0x18 =
         (int)((ulong)(iVar1 * (texture->Size).Height) / ((ulong)imageSize >> 0x20));
    this->UseAlphaChannel = useAlphaChannel;
  }
  return texture != (ITexture *)0x0;
}

Assistant:

bool CGUIImageList::createImageList(video::ITexture *texture,
		core::dimension2d<s32> imageSize,
		bool useAlphaChannel)
{
	if (!texture) {
		return false;
	}

	Texture = texture;
	Texture->grab();

	ImageSize = imageSize;

	ImagesPerRow = Texture->getSize().Width / ImageSize.Width;
	ImageCount = ImagesPerRow * Texture->getSize().Height / ImageSize.Height;

	UseAlphaChannel = useAlphaChannel;

	return true;
}